

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

void __thiscall
BasicBlock::RemovePred
          (BasicBlock *this,BasicBlock *block,FlowGraph *graph,bool doCleanSucc,bool moveToDead)

{
  code *pcVar1;
  bool bVar2;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar3;
  Type *ppFVar4;
  BasicBlock *pBVar5;
  undefined4 *puVar6;
  Loop *loop;
  BasicBlock *blockSucc;
  FlowEdge **edge;
  EditingIterator iter;
  bool moveToDead_local;
  bool doCleanSucc_local;
  FlowGraph *graph_local;
  BasicBlock *block_local;
  BasicBlock *this_local;
  
  iter.last._6_1_ = moveToDead;
  iter.last._7_1_ = doCleanSucc;
  pSVar3 = &GetPredList(this)->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::GetEditingIterator
            ((EditingIterator *)&edge,pSVar3);
  do {
    bVar2 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                      ((EditingIterator *)&edge);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0xc7d,"((0))","Edge not found.");
      if (bVar2) {
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
        return;
      }
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    ppFVar4 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)&edge);
    pBVar5 = FlowEdge::GetPred(*ppFVar4);
  } while (pBVar5 != block);
  pBVar5 = FlowEdge::GetSucc(*ppFVar4);
  if ((iter.last._6_1_ & 1) == 0) {
    SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::RemoveCurrent
              ((EditingIterator *)&edge,&graph->alloc->super_ArenaAllocator);
  }
  else {
    pSVar3 = &GetDeadPredList(this)->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
    SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::MoveCurrentTo
              ((EditingIterator *)&edge,pSVar3);
  }
  if ((iter.last._7_1_ & 1) != 0) {
    RemoveSucc(block,this,graph,false,(bool)(iter.last._6_1_ & 1));
  }
  if (((*(ushort *)&pBVar5->field_0x18 >> 2 & 1) != 0) && (pBVar5->loop != (Loop *)0x0)) {
    pSVar3 = &GetPredList(pBVar5)->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
    bVar2 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::HasOne(pSVar3);
    if (bVar2) {
      *(ushort *)&pBVar5->loop->field_0x178 = *(ushort *)&pBVar5->loop->field_0x178 & 0xfffe | 1;
    }
  }
  return;
}

Assistant:

void
BasicBlock::RemovePred(BasicBlock *block, FlowGraph * graph, bool doCleanSucc, bool moveToDead)
{
    FOREACH_SLISTBASECOUNTED_ENTRY_EDITING(FlowEdge*, edge, this->GetPredList(), iter)
    {
        if (edge->GetPred() == block)
        {
            BasicBlock *blockSucc = edge->GetSucc();
            if (moveToDead)
            {
                iter.MoveCurrentTo(this->GetDeadPredList());

            }
            else
            {
                iter.RemoveCurrent(graph->alloc);
            }
            if (doCleanSucc)
            {
                block->RemoveSucc(this, graph, false, moveToDead);
            }
            if (blockSucc->isLoopHeader && blockSucc->loop && blockSucc->GetPredList()->HasOne())
            {
                Loop *loop = blockSucc->loop;
                loop->isDead = true;
            }
            return;
        }
    } NEXT_SLISTBASECOUNTED_ENTRY_EDITING;
    AssertMsg(UNREACHED, "Edge not found.");
}